

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_drawPolySeg(FPolySeg *seg,AMColor *color)

{
  int iVar1;
  undefined1 local_38 [8];
  mline_t l;
  AMColor *color_local;
  FPolySeg *seg_local;
  
  local_38 = (undefined1  [8])(seg->v1).pos.X;
  l.a.x = (seg->v1).pos.Y;
  l.a.y = (seg->v2).pos.X;
  l.b.x = (seg->v2).pos.Y;
  l.b.y = (double)color;
  iVar1 = FIntCVar::operator_cast_to_int(&am_rotate);
  if (iVar1 != 1) {
    iVar1 = FIntCVar::operator_cast_to_int(&am_rotate);
    if ((iVar1 != 2) || ((viewactive & 1U) == 0)) goto LAB_0042cdef;
  }
  AM_rotatePoint((double *)local_38,(double *)&l);
  AM_rotatePoint(&l.a.y,&l.b.x);
LAB_0042cdef:
  AM_drawMline((mline_t *)local_38,(AMColor *)l.b.y);
  return;
}

Assistant:

void AM_drawPolySeg(FPolySeg *seg, const AMColor &color)
{
	mline_t l;
	l.a.x = seg->v1.pos.X;
	l.a.y = seg->v1.pos.Y;
	l.b.x = seg->v2.pos.X;
	l.b.y = seg->v2.pos.Y;

	if (am_rotate == 1 || (am_rotate == 2 && viewactive))
	{
		AM_rotatePoint (&l.a.x, &l.a.y);
		AM_rotatePoint (&l.b.x, &l.b.y);
	}
	AM_drawMline(&l, color);
}